

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::Array<iovec>::dispose(Array<iovec> *this)

{
  iovec *piVar1;
  size_t sVar2;
  
  piVar1 = this->ptr;
  if (piVar1 != (iovec *)0x0) {
    sVar2 = this->size_;
    this->ptr = (iovec *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)(this->disposer,piVar1,0x10,sVar2,sVar2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }